

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_lower.c
# Opt level: O0

AstNode * lower_for_in_statement(CompilerState *compiler_state,AstNode *node)

{
  AstNodeList *pAVar1;
  int nvars;
  anon_union_72_25_595a31af_for_AstNode_2 *paVar2;
  AstNode *__src;
  Scope *scope;
  AstNode *pAVar3;
  StringObject *pSVar4;
  LuaSymbol *pLVar5;
  LuaSymbol *sym;
  LuaSymbol *sym_00;
  AstNode *pAVar6;
  AstNode *pAVar7;
  AstNode *pAVar8;
  Scope *pSVar9;
  AstNode *pAVar10;
  AstNode *while_do_stmt;
  AstNode *assignstmt;
  AstNode *gotostmt;
  Scope *if_scope;
  AstNode *test_then_block;
  AstNode *if_stmt;
  LuaSymbol *var1sym;
  AstNode *call_expr;
  AstNode *local_stmt2;
  Scope *while_scope;
  AstNode *while_stmt;
  LuaSymbol *varsym;
  LuaSymbol *ssym;
  LuaSymbol *fsym;
  AstNode *local_stmt;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char var [10];
  char s [8];
  char f [8];
  Scope *do_scope;
  AstNode *do_stmt;
  Scope *for_body_scope;
  Scope *for_scope;
  AstNode *function;
  ForStatement *for_stmt;
  AstNode *node_local;
  CompilerState *compiler_state_local;
  
  paVar2 = &node->field_2;
  pAVar10 = ((paVar2->do_stmt).scope)->function;
  pSVar9 = (paVar2->do_stmt).scope;
  pAVar1 = (AstNodeList *)(node->field_2).function_stmt.function_expr;
  __src = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,node->line_number);
  (__src->field_2).goto_stmt.name = (StringObject *)0x0;
  scope = raviX_allocate_scope(compiler_state,pAVar10,pSVar9->parent);
  (__src->field_2).do_stmt.scope = scope;
  builtin_strncpy(s,"(for_f)",8);
  builtin_strncpy(var + 2,"(for_s)",8);
  local_stmt._6_1_ = '(';
  local_stmt._7_1_ = 'f';
  cStack_60 = 'o';
  cStack_5f = 'r';
  cStack_5e = '_';
  cStack_5d = 'v';
  cStack_5c = 'a';
  cStack_5b = 'r';
  var[0] = ')';
  var[1] = '\0';
  pAVar3 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,node->line_number);
  (pAVar3->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  (pAVar3->field_2).goto_stmt.name = (StringObject *)(node->field_2).goto_stmt.goto_scope;
  pSVar4 = raviX_create_string(compiler_state,s,7);
  pLVar5 = raviX_new_local_symbol(compiler_state,scope,pSVar4,RAVI_TANY,(StringObject *)0x0);
  pSVar4 = raviX_create_string(compiler_state,var + 2,7);
  sym = raviX_new_local_symbol(compiler_state,scope,pSVar4,RAVI_TANY,(StringObject *)0x0);
  pSVar4 = raviX_create_string(compiler_state,(char *)((long)&local_stmt + 6),9);
  sym_00 = raviX_new_local_symbol(compiler_state,scope,pSVar4,RAVI_TANY,(StringObject *)0x0);
  *(byte *)((long)&pLVar5->field_1 + 0x28) = *(byte *)((long)&pLVar5->field_1 + 0x28) & 0xfb | 4;
  *(byte *)((long)&sym->field_1 + 0x28) = *(byte *)((long)&sym->field_1 + 0x28) & 0xfb | 4;
  *(byte *)((long)&sym_00->field_1 + 0x28) = *(byte *)((long)&sym_00->field_1 + 0x28) & 0xfb | 4;
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&(pAVar3->field_2).return_stmt,pLVar5);
  raviX_add_symbol(compiler_state,&scope->symbol_list,pLVar5);
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&(pAVar3->field_2).return_stmt,sym);
  raviX_add_symbol(compiler_state,&scope->symbol_list,sym);
  raviX_add_symbol(compiler_state,(LuaSymbolList **)&(pAVar3->field_2).return_stmt,sym_00);
  raviX_add_symbol(compiler_state,&scope->symbol_list,sym_00);
  add_ast_node(compiler_state,&(__src->field_2).local_stmt.expr_list,pAVar3);
  pAVar3 = raviX_allocate_ast_node_at_line(compiler_state,STMT_WHILE,node->line_number);
  pSVar9->parent = scope;
  (pAVar3->field_2).test_then_block.test_then_scope = pSVar9;
  (pAVar3->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  pAVar6 = true_expression(compiler_state);
  (pAVar3->field_2).function_stmt.name = pAVar6;
  add_ast_node(compiler_state,&(__src->field_2).local_stmt.expr_list,pAVar3);
  pAVar6 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,node->line_number);
  (pAVar6->field_2).return_stmt.expr_list = (AstNodeList *)(node->field_2).goto_stmt.name;
  (pAVar6->field_2).goto_stmt.name = (StringObject *)0x0;
  nvars = symbollist_num_symbols((node->field_2).for_stmt.symbols);
  pAVar7 = call_iterator_function(compiler_state,pLVar5,sym,sym_00,nvars);
  add_ast_node(compiler_state,&(pAVar6->field_2).local_stmt.expr_list,pAVar7);
  add_ast_node(compiler_state,&(pAVar3->field_2).test_then_block.test_then_statement_list,pAVar6);
  pLVar5 = get_first_node((node->field_2).for_stmt.symbols);
  pAVar6 = raviX_allocate_ast_node_at_line(compiler_state,STMT_IF,node->line_number);
  (pAVar6->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  (pAVar6->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar6->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  pAVar7 = raviX_allocate_ast_node_at_line(compiler_state,STMT_TEST_THEN,node->line_number);
  pAVar8 = var_is_nil(compiler_state,pLVar5);
  (pAVar7->field_2).function_stmt.name = pAVar8;
  (pAVar7->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar7->field_2).goto_stmt.goto_scope = (Scope *)0x0;
  pSVar9 = raviX_allocate_scope(compiler_state,pAVar10,pSVar9);
  (pAVar7->field_2).test_then_block.test_then_scope = pSVar9;
  pAVar10 = break_statment(compiler_state,pSVar9);
  add_ast_node(compiler_state,&(pAVar7->field_2).test_then_block.test_then_statement_list,pAVar10);
  add_ast_node(compiler_state,&(pAVar6->field_2).return_stmt.expr_list,pAVar7);
  add_ast_node(compiler_state,&(pAVar3->field_2).test_then_block.test_then_statement_list,pAVar6);
  pAVar10 = raviX_allocate_ast_node_at_line(compiler_state,STMT_EXPR,node->line_number);
  (pAVar10->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
  (pAVar10->field_2).goto_stmt.name = (StringObject *)0x0;
  pAVar6 = make_symbol_expr(compiler_state,sym_00);
  add_ast_node(compiler_state,&(pAVar10->field_2).return_stmt.expr_list,pAVar6);
  pLVar5 = get_first_node((node->field_2).for_stmt.symbols);
  pAVar6 = make_symbol_expr(compiler_state,pLVar5);
  add_ast_node(compiler_state,&(pAVar10->field_2).local_stmt.expr_list,pAVar6);
  add_ast_node(compiler_state,&(pAVar3->field_2).test_then_block.test_then_statement_list,pAVar10);
  pAVar10 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,node->line_number);
  (pAVar10->field_2).goto_stmt.name = (StringObject *)0x0;
  (pAVar10->field_2).return_stmt.expr_list = pAVar1;
  add_ast_node(compiler_state,&(pAVar3->field_2).test_then_block.test_then_statement_list,pAVar10);
  (pAVar10->field_2).goto_stmt.name = (StringObject *)(node->field_2).for_stmt.for_statement_list;
  (node->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  (node->field_2).function_stmt.function_expr = (AstNode *)0x0;
  (paVar2->local_stmt).var_list = (LuaSymbolList *)0x0;
  memcpy(node,__src,0x50);
  return node;
}

Assistant:

static AstNode * lower_for_in_statement(CompilerState *compiler_state, AstNode *node)
{
	ForStatement *for_stmt = &node->for_stmt;
	AstNode *function = for_stmt->for_scope->function;
	Scope *for_scope = for_stmt->for_scope;
	Scope *for_body_scope = for_stmt->for_body;

//	fprintf(stderr, "for parent scope = %p\n", for_scope->parent);
//	fprintf(stderr, "for scope = %p\n", for_scope);
//	fprintf(stderr, "for body scope = %p\n", for_body_scope);
//	fprintf(stderr, "for body parent scope = %p\n", for_body_scope->parent);


	// FIXME - the for variables must be removed from parent scope

	// Create do block
	AstNode *do_stmt = raviX_allocate_ast_node_at_line(compiler_state, STMT_DO, node->line_number);
	do_stmt->do_stmt.do_statement_list = NULL;

	// The do block will get a new scope
	// The original for block scope will go into the child while statement block
	Scope *do_scope = raviX_allocate_scope(compiler_state, function, for_scope->parent);
	do_stmt->do_stmt.scope = do_scope;

	// do block has 3 hidden locals
	const char f[] = "(for_f)";
	const char s[] = "(for_s)";
	const char var[] = "(for_var)";

	AstNode *local_stmt = raviX_allocate_ast_node_at_line(compiler_state, STMT_LOCAL, node->line_number);
	local_stmt->local_stmt.var_list = NULL;
	local_stmt->local_stmt.expr_list = for_stmt->expr_list;

	LuaSymbol *fsym = raviX_new_local_symbol(compiler_state, do_scope, raviX_create_string(compiler_state, f, sizeof f-1), RAVI_TANY, NULL);
	LuaSymbol *ssym = raviX_new_local_symbol(compiler_state, do_scope, raviX_create_string(compiler_state, s, sizeof s-1), RAVI_TANY, NULL);
	LuaSymbol *varsym = raviX_new_local_symbol(compiler_state, do_scope, raviX_create_string(compiler_state, var, sizeof var-1), RAVI_TANY, NULL);

	fsym->variable.modified = 1;
	ssym->variable.modified = 1;
	varsym->variable.modified = 1;

	raviX_add_symbol(compiler_state, &local_stmt->local_stmt.var_list, fsym);
	raviX_add_symbol(compiler_state, &do_scope->symbol_list, fsym);
	raviX_add_symbol(compiler_state, &local_stmt->local_stmt.var_list, ssym);
	raviX_add_symbol(compiler_state, &do_scope->symbol_list, ssym);
	raviX_add_symbol(compiler_state, &local_stmt->local_stmt.var_list, varsym);
	raviX_add_symbol(compiler_state, &do_scope->symbol_list, varsym);

	add_ast_node(compiler_state, &do_stmt->do_stmt.do_statement_list, local_stmt);

	// Create while block

	AstNode *while_stmt = raviX_allocate_ast_node_at_line(compiler_state, STMT_WHILE, node->line_number);
	Scope *while_scope = for_scope; // Original scope of the generic for statement
	while_scope->parent = do_scope; // change the original scope's parent to be the do block
	while_stmt->while_or_repeat_stmt.loop_scope = while_scope;
	while_stmt->while_or_repeat_stmt.loop_statement_list = NULL;
	while_stmt->while_or_repeat_stmt.condition = true_expression(compiler_state);
	add_ast_node(compiler_state, &do_stmt->do_stmt.do_statement_list, while_stmt);

	// Call the iterator function

	AstNode *local_stmt2 = raviX_allocate_ast_node_at_line(compiler_state, STMT_LOCAL, node->line_number);
	local_stmt2->local_stmt.var_list = for_stmt->symbols;
	local_stmt2->local_stmt.expr_list = NULL;
	AstNode *call_expr = call_iterator_function(compiler_state, fsym, ssym, varsym, symbollist_num_symbols(for_stmt->symbols));
	add_ast_node(compiler_state, &local_stmt2->local_stmt.expr_list, call_expr);
	add_ast_node(compiler_state, &while_stmt->while_or_repeat_stmt.loop_statement_list, local_stmt2);

	LuaSymbol *var1sym = get_first_node(for_stmt->symbols);

	// if var_1 == nil break
	AstNode *if_stmt = raviX_allocate_ast_node_at_line(compiler_state, STMT_IF, node->line_number);
	if_stmt->if_stmt.if_condition_list = NULL;
	if_stmt->if_stmt.else_block = NULL;
	if_stmt->if_stmt.else_statement_list = NULL;

	AstNode *test_then_block =
	    raviX_allocate_ast_node_at_line(compiler_state, STMT_TEST_THEN, node->line_number);			       // This is not an AST node on its own
	test_then_block->test_then_block.condition = var_is_nil(compiler_state, var1sym); /* read condition */
	test_then_block->test_then_block.test_then_scope = NULL;
	test_then_block->test_then_block.test_then_statement_list = NULL;

	Scope *if_scope = raviX_allocate_scope(compiler_state, function, while_scope);
	test_then_block->test_then_block.test_then_scope = if_scope;
	AstNode *gotostmt = break_statment(compiler_state, if_scope); /* handle goto/break */
	add_ast_node(compiler_state, &test_then_block->test_then_block.test_then_statement_list, gotostmt);
	add_ast_node(compiler_state, &if_stmt->if_stmt.if_condition_list, test_then_block);
	add_ast_node(compiler_state, &while_stmt->while_or_repeat_stmt.loop_statement_list, if_stmt);

	// assign var_1 to (for_var)

	AstNode *assignstmt = raviX_allocate_ast_node_at_line(compiler_state, STMT_EXPR, node->line_number);
	assignstmt->expression_stmt.var_expr_list = NULL;
	assignstmt->expression_stmt.expr_list = NULL;
	add_ast_node(compiler_state, &assignstmt->expression_stmt.var_expr_list, make_symbol_expr(compiler_state, varsym));
	add_ast_node(compiler_state, &assignstmt->expression_stmt.expr_list, make_symbol_expr(compiler_state, get_first_node(for_stmt->symbols)));
	add_ast_node(compiler_state, &while_stmt->while_or_repeat_stmt.loop_statement_list, assignstmt);

	// Copy the original block in for
	// Create do block
	AstNode *while_do_stmt = raviX_allocate_ast_node_at_line(compiler_state, STMT_DO, node->line_number);
	while_do_stmt->do_stmt.do_statement_list = NULL;
	while_do_stmt->do_stmt.scope = for_body_scope;
	add_ast_node(compiler_state, &while_stmt->while_or_repeat_stmt.loop_statement_list, while_do_stmt);

	while_do_stmt->do_stmt.do_statement_list = for_stmt->for_statement_list;
	for_stmt->for_statement_list = NULL;
	for_stmt->for_body = NULL;
	for_stmt->for_scope = NULL;

//	fprintf(stderr, "do parent scope = %p\n", do_scope->parent);
//	fprintf(stderr, "do scope = %p\n", do_scope);
//	fprintf(stderr, "while scope = %p\n", while_scope);
//	fprintf(stderr, "while parent scope = %p\n", while_scope->parent);
//	fprintf(stderr, "if scope = %p\n", if_scope);
//	fprintf(stderr, "if parent scope = %p\n", if_scope->parent);
//	fprintf(stderr, "while do scope = %p\n", for_body_scope);
//	fprintf(stderr, "while do scope parent = %p\n", for_body_scope->parent);


	// Replace the original generic for ast with the new do block
	*node = *do_stmt;
	return node;
}